

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

int fy_atom_iter_utf8_get(fy_atom_iter *iter)

{
  uint uVar1;
  int local_30 [2];
  int w;
  int c;
  ssize_t nread;
  fy_atom_iter *pfStack_18;
  uint8_t buf [4];
  fy_atom_iter *iter_local;
  
  if (iter == (fy_atom_iter *)0x0) {
    iter_local._4_4_ = 0xffffffff;
  }
  else if (iter->unget_c == -1) {
    pfStack_18 = iter;
    _w = fy_atom_iter_read(iter,(void *)((long)&nread + 4),1);
    if (_w == 1) {
      local_30[0] = fy_utf8_width_by_first_octet(nread._4_1_);
      if (local_30[0] == 0) {
        iter_local._4_4_ = 0xffffffff;
      }
      else if ((local_30[0] < 2) ||
              (_w = fy_atom_iter_read(pfStack_18,(void *)((long)&nread + 5),(long)(local_30[0] + -1)
                                     ), _w == local_30[0] + -1)) {
        iter_local._4_4_ = fy_utf8_get((void *)((long)&nread + 4),local_30[0],local_30);
      }
      else {
        iter_local._4_4_ = 0xffffffff;
      }
    }
    else {
      iter_local._4_4_ = 0xffffffff;
    }
  }
  else {
    uVar1 = iter->unget_c;
    iter->unget_c = -1;
    iter_local._4_4_ = uVar1 & 0xff;
  }
  return iter_local._4_4_;
}

Assistant:

int fy_atom_iter_utf8_get(struct fy_atom_iter *iter) {
    uint8_t buf[4];    /* maximum utf8 is 4 octets */
    ssize_t nread;
    int c, w;

    if (!iter)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w)
        return -1;

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1))
            return -1;
    }

    /* and return the decoded utf8 character */
    return fy_utf8_get(buf, w, &w);
}